

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::FamilyTest_reject_histogram_with_constant_le_label_Test::TestBody
          (FamilyTest_reject_histogram_with_constant_le_label_Test *this)

{
  bool bVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_89;
  AssertHelper local_88;
  long *local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  Labels labels;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_78,(char (*) [3])0x16b9eb,(char (*) [5])0x16a870);
  __l._M_len = 1;
  __l._M_array = &local_78;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&labels,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_88,&local_89);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      detail::
      make_unique<prometheus::Family<prometheus::Histogram>,char_const(&)[5],char_const(&)[5],std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
                ((detail *)&local_80,(char (*) [5])0x16d46f,(char (*) [5])0x1711c3,&labels);
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::Message::Message((Message *)&local_78);
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/family_test.cc"
             ,0x7b,
             "Expected: detail::make_unique<Family<Histogram>>(\"name\", \"help\", labels) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if ((long *)local_78.first._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_78.first._M_dataplus._M_p + 8))();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&labels._M_t);
  return;
}

Assistant:

TEST(FamilyTest, reject_histogram_with_constant_le_label) {
  auto labels = Labels{{"le", "test"}};
  EXPECT_ANY_THROW(
      detail::make_unique<Family<Histogram>>("name", "help", labels));
}